

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUpDownButton.cpp
# Opt level: O0

void __thiscall QUpDownButtonPrivate::updateButtonArrows(QUpDownButtonPrivate *this)

{
  Orientation OVar1;
  QUpDownButtonPrivate *in_RDI;
  
  QBoxLayout::direction();
  OVar1 = directionToOrientation(in_RDI,LeftToRight);
  if (OVar1 == Horizontal) {
    QToolButton::setArrowType((ArrowType)in_RDI->upButton);
    QToolButton::setArrowType((ArrowType)in_RDI->downButton);
  }
  else if (OVar1 == Vertical) {
    QToolButton::setArrowType((ArrowType)in_RDI->upButton);
    QToolButton::setArrowType((ArrowType)in_RDI->downButton);
  }
  return;
}

Assistant:

void updateButtonArrows() {
        switch (directionToOrientation(layout->direction())) {
        case Qt::Horizontal:
            upButton->setArrowType(Qt::LeftArrow);
            downButton->setArrowType(Qt::RightArrow);
            break;
        case Qt::Vertical:
            upButton->setArrowType(Qt::UpArrow);
            downButton->setArrowType(Qt::DownArrow);
            break;
        }
    }